

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5PoslistSafeAppend(Fts5Buffer *pBuf,i64 *piPrev,i64 iPos)

{
  int iVar1;
  i64 iPos_local;
  i64 *piPrev_local;
  Fts5Buffer *pBuf_local;
  
  if ((iPos & 0x7fffffff00000000U) != (*piPrev & 0x7fffffff00000000U)) {
    iVar1 = pBuf->n;
    pBuf->n = iVar1 + 1;
    pBuf->p[iVar1] = '\x01';
    iVar1 = sqlite3Fts5PutVarint(pBuf->p + pBuf->n,iPos >> 0x20);
    pBuf->n = iVar1 + pBuf->n;
    *piPrev = iPos & 0x7fffffff00000000;
  }
  iVar1 = sqlite3Fts5PutVarint(pBuf->p + pBuf->n,(iPos - *piPrev) + 2);
  pBuf->n = iVar1 + pBuf->n;
  *piPrev = iPos;
  return;
}

Assistant:

static void sqlite3Fts5PoslistSafeAppend(
  Fts5Buffer *pBuf, 
  i64 *piPrev, 
  i64 iPos
){
  static const i64 colmask = ((i64)(0x7FFFFFFF)) << 32;
  if( (iPos & colmask) != (*piPrev & colmask) ){
    pBuf->p[pBuf->n++] = 1;
    pBuf->n += sqlite3Fts5PutVarint(&pBuf->p[pBuf->n], (iPos>>32));
    *piPrev = (iPos & colmask);
  }
  pBuf->n += sqlite3Fts5PutVarint(&pBuf->p[pBuf->n], (iPos-*piPrev)+2);
  *piPrev = iPos;
}